

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufErase(xmlBufPtr buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar1 = (ulong)buf->compat_size;
    if ((uVar1 < 0x7fffffff) && (buf->size != uVar1)) {
      buf->size = uVar1;
    }
    uVar2 = (ulong)buf->compat_use;
    uVar1 = buf->use;
    if (buf->use != uVar2 && uVar2 < 0x7fffffff) {
      buf->use = uVar2;
      uVar1 = uVar2;
    }
    if (len <= uVar1) {
      buf->use = uVar1 - len;
      buf->content[uVar1 - len] = '\0';
      uVar1 = buf->size;
      if (0x7ffffffe < uVar1) {
        uVar1 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar1;
      uVar1 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar1 = buf->use;
      }
      buf->compat_use = (uint)uVar1;
      return 0;
    }
  }
  return -1;
}

Assistant:

int
xmlBufErase(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (len > buf->use)
        return(-1);
    buf->use -= len;
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return(0);
}